

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector3.c
# Opt level: O3

char * vector3_all_tests(void)

{
  short sVar1;
  vector3 r;
  vector3 b;
  vector3 a;
  anon_union_24_3_07544b15_for_vector3_0 local_60;
  vector3 local_48;
  vector3 local_30;
  
  vector3_setf3(&local_30,3.0,-3.0,1.0);
  vector3_setf3(&local_48,4.0,9.0,2.0);
  vector3_cross_product((vector3 *)&local_60.field_1,&local_30,&local_48);
  sVar1 = scalar_equalsf(local_60.v[0],-15.0);
  if (sVar1 == 0) {
    test_message = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(14) : (assertion failed) ((scalar_equalsf(r.x, -15.0f)))"
    ;
  }
  else {
    sVar1 = scalar_equalsf(local_60.v[1],-2.0);
    if (sVar1 == 0) {
      test_message = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(15) : (assertion failed) ((scalar_equalsf(r.y, -2.0f)))"
      ;
    }
    else {
      sVar1 = scalar_equalsf(local_60.v[2],39.0);
      if (sVar1 == 0) {
        test_message = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(16) : (assertion failed) ((scalar_equalsf(r.z, 39.0f)))"
        ;
      }
      else {
        vector3_cross_product((vector3 *)&local_60.field_1,&local_48,&local_30);
        sVar1 = scalar_equalsf(local_60.v[0],-15.0);
        if (sVar1 == 0) {
          sVar1 = scalar_equalsf(local_60.v[1],-2.0);
          if (sVar1 == 0) {
            sVar1 = scalar_equalsf(local_60.v[2],39.0);
            test_message = (char *)0x0;
            if (sVar1 != 0) {
              test_message = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(23) : (assertion failed) ((!scalar_equalsf(r.z, 39.0f)))"
              ;
            }
          }
          else {
            test_message = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(22) : (assertion failed) ((!scalar_equalsf(r.y, -2.0f)))"
            ;
          }
        }
        else {
          test_message = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_vector3.c(21) : (assertion failed) ((!scalar_equalsf(r.x, -15.0f)))"
          ;
        }
      }
    }
  }
  tests_run = tests_run + 1;
  return test_message;
}

Assistant:

static char *vector3_all_tests(void)
{
	run_test(test_vector3_cross_product);

	return NULL;
}